

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall QMimeXMLProvider::addAllMimeTypes(QMimeXMLProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Entry *pEVar2;
  QArrayData *data;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  QMimeType *pQVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  const_iterator __it;
  uint uVar10;
  Data *pDVar11;
  const_iterator cVar12;
  long lVar13;
  long in_FS_OFFSET;
  QMimeTypePrivate local_60;
  QMimeType local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar11 = (this->m_nameMimeTypeMap).d;
  if ((result->d).size == 0) {
    if (pDVar11 == (Data *)0x0) {
      pDVar11 = (Data *)0x0;
LAB_004bd5e8:
      uVar9 = 0;
    }
    else {
      if (pDVar11->spans->offsets[0] != 0xff) goto LAB_004bd5e8;
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if (pDVar11->numBuckets == uVar9) {
          pDVar11 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar8 = uVar9 + 1;
      } while (pDVar11->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    }
    if (uVar9 != 0 || pDVar11 != (Data *)0x0) {
      do {
        pEVar2 = pDVar11->spans[uVar9 >> 7].entries;
        bVar1 = pDVar11->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
        lVar7 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
        local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
        local_60.name.d.d = *(Data **)((pEVar2->storage).data + lVar7 + 0x20);
        local_60.name.d.ptr = *(char16_t **)((pEVar2->storage).data + lVar7 + 0x28);
        local_60.name.d.size = *(qsizetype *)((pEVar2->storage).data + lVar7 + 0x30);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMimeType::QMimeType(&local_40,&local_60);
        QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                  ((QMovableArrayOps<QMimeType> *)result,(result->d).size,&local_40);
        QList<QMimeType>::end(result);
        QMimeType::~QMimeType(&local_40);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,2,0x10);
          }
        }
        do {
          if (pDVar11->numBuckets - 1 == uVar9) {
            uVar9 = 0;
            pDVar11 = (Data *)0x0;
            break;
          }
          uVar9 = uVar9 + 1;
        } while (pDVar11->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      } while ((uVar9 != 0) || (pDVar11 != (Data *)0x0));
    }
    goto LAB_004bd6f5;
  }
  if (pDVar11 == (Data *)0x0) {
    pDVar11 = (Data *)0x0;
LAB_004bd280:
    uVar9 = 0;
  }
  else {
    if (pDVar11->spans->offsets[0] != 0xff) goto LAB_004bd280;
    uVar8 = 1;
    do {
      uVar9 = uVar8;
      if (pDVar11->numBuckets == uVar9) {
        pDVar11 = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar8 = uVar9 + 1;
    } while (pDVar11->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  }
  if (pDVar11 != (Data *)0x0 || uVar9 != 0) {
    do {
      uVar8 = uVar9 >> 7;
      uVar10 = (uint)uVar9 & 0x7f;
      pEVar2 = pDVar11->spans[uVar8].entries;
      bVar1 = pDVar11->spans[uVar8].offsets[uVar10];
      lVar7 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
      data = *(QArrayData **)((pEVar2->storage).data + lVar7);
      pQVar3 = *(QArrayData **)((pEVar2->storage).data + lVar7 + 8);
      pcVar4 = *(char16_t **)((pEVar2->storage).data + lVar7 + 0x10);
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar5 = (result->d).ptr;
      lVar7 = (result->d).size;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar13 = lVar7 >> 2;
      __it.i = pQVar5;
      local_60._0_8_ = data;
      local_60.name.d.d = (Data *)pQVar3;
      local_60.name.d.ptr = pcVar4;
      if (0 < lVar13) {
        lVar13 = lVar13 + 1;
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                            ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it);
          cVar12.i = __it.i;
          if (bVar6) goto LAB_004bd436;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                            ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 1);
          cVar12.i = __it.i + 1;
          if (bVar6) goto LAB_004bd436;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                            ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 2);
          cVar12.i = __it.i + 2;
          if (bVar6) goto LAB_004bd436;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                            ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 3);
          cVar12.i = __it.i + 3;
          if (bVar6) goto LAB_004bd436;
          __it.i = __it.i + 4;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
      }
      pQVar5 = pQVar5 + lVar7;
      lVar7 = (long)pQVar5 - (long)__it.i >> 3;
      if (lVar7 == 1) {
LAB_004bd423:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_60,__it);
        cVar12.i = pQVar5;
        if (bVar6) {
          cVar12.i = __it.i;
        }
      }
      else if (lVar7 == 2) {
LAB_004bd409:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_60,__it);
        cVar12.i = __it.i;
        if (!bVar6) {
          __it.i = __it.i + 1;
          goto LAB_004bd423;
        }
      }
      else {
        cVar12.i = pQVar5;
        if ((lVar7 == 3) &&
           (bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                    operator()((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                                *)&local_60,__it), cVar12.i = __it.i, !bVar6)) {
          __it.i = __it.i + 1;
          goto LAB_004bd409;
        }
      }
LAB_004bd436:
      if ((QArrayData *)local_60._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_60._0_8_,2,0x10);
        }
      }
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      lVar7 = (result->d).size;
      pQVar5 = (result->d).ptr;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      if (cVar12.i == pQVar5 + lVar7) {
        pEVar2 = pDVar11->spans[uVar8].entries;
        bVar1 = pDVar11->spans[uVar8].offsets[uVar10];
        lVar7 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
        local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
        local_60.name.d.d = *(Data **)((pEVar2->storage).data + lVar7 + 0x20);
        local_60.name.d.ptr = *(char16_t **)((pEVar2->storage).data + lVar7 + 0x28);
        local_60.name.d.size = *(qsizetype *)((pEVar2->storage).data + lVar7 + 0x30);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMimeType::QMimeType(&local_40,&local_60);
        QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                  ((QMovableArrayOps<QMimeType> *)result,(result->d).size,&local_40);
        QList<QMimeType>::end(result);
        QMimeType::~QMimeType(&local_40);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      do {
        if (pDVar11->numBuckets - 1 == uVar9) {
          pDVar11 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pDVar11->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((pDVar11 != (Data *)0x0) || (uVar9 != 0));
  }
LAB_004bd6f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    if (result.isEmpty()) { // fast path
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd();
             it != end; ++it) {
            result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    } else {
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd() ; it != end ; ++it) {
            const QString newMime = it.key();
            if (std::find_if(result.constBegin(), result.constEnd(), [newMime](const QMimeType &mime) -> bool { return mime.name() == newMime; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    }
}